

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readpsm.c
# Opt level: O0

void dumb_it_optimize_orders(DUMB_IT_SIGDATA *sigdata)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  IT_PATTERN *p2;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  long in_RDI;
  IT_PATTERN *pattern;
  int n_patterns;
  uchar *order_list;
  int p;
  int o;
  int n;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int local_10;
  uint local_c;
  
  if ((*(int *)(in_RDI + 0x50) != 0) && (*(int *)(in_RDI + 0x5c) != 0)) {
    local_24 = 0;
    p2 = (IT_PATTERN *)malloc((long)*(int *)(in_RDI + 0x50));
    if (p2 != (IT_PATTERN *)0x0) {
      for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x50); local_c = local_c + 1) {
        if ((int)(uint)*(byte *)(*(long *)(in_RDI + 0x100) + (long)(int)local_c) <
            *(int *)(in_RDI + 0x5c)) {
          for (local_10 = 0;
              (local_10 < local_24 &&
              (*(char *)(*(long *)(in_RDI + 0x100) + (long)(int)local_c) !=
               *(char *)((long)&p2->n_rows + (long)local_10))); local_10 = local_10 + 1) {
          }
          if (local_10 == local_24) {
            *(undefined1 *)((long)&p2->n_rows + (long)local_24) =
                 *(undefined1 *)(*(long *)(in_RDI + 0x100) + (long)(int)local_c);
            local_24 = local_24 + 1;
          }
        }
      }
      if (local_24 == 0) {
        free(p2);
      }
      else {
        for (local_c = 0; uVar1 = local_c, (int)local_c < local_24; local_c = local_c + 1) {
          while (iVar3 = uVar1, local_10 = iVar3 + 1, local_10 < local_24) {
            uVar1 = local_10;
            if ((*(char *)((long)&p2->n_rows + (long)(int)local_c) !=
                 *(char *)((long)&p2->n_rows + (long)local_10)) &&
               (iVar2 = it_pattern_compare((IT_PATTERN *)
                                           CONCAT44(in_stack_ffffffffffffffec,
                                                    in_stack_ffffffffffffffe8),p2), uVar1 = local_10
               , iVar2 != 0)) {
              for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x50); iVar2 = iVar2 + 1) {
                if (*(char *)(*(long *)(in_RDI + 0x100) + (long)iVar2) ==
                    *(char *)((long)&p2->n_rows + (long)local_10)) {
                  *(undefined1 *)(*(long *)(in_RDI + 0x100) + (long)iVar2) =
                       *(undefined1 *)((long)&p2->n_rows + (long)(int)local_c);
                }
              }
              for (in_stack_ffffffffffffffec = iVar3 + 2; in_stack_ffffffffffffffec < local_24;
                  in_stack_ffffffffffffffec = in_stack_ffffffffffffffec + 1) {
                if (*(char *)((long)&p2->n_rows + (long)in_stack_ffffffffffffffec) ==
                    *(char *)((long)&p2->n_rows + (long)local_10)) {
                  *(undefined1 *)((long)&p2->n_rows + (long)in_stack_ffffffffffffffec) =
                       *(undefined1 *)((long)&p2->n_rows + (long)(int)local_c);
                }
              }
              *(undefined1 *)((long)&p2->n_rows + (long)local_10) =
                   *(undefined1 *)((long)&p2->n_rows + (long)(int)local_c);
              uVar1 = local_10;
            }
          }
        }
        qsort(p2,(long)local_24,1,it_order_compare);
        local_10 = 0;
        for (local_c = 0; (int)local_c < local_24; local_c = local_c + 1) {
          if ((*(char *)((long)&p2->n_rows + (long)(int)local_c) !=
               *(char *)((long)&p2->n_rows + (long)local_10)) &&
             (local_10 = local_10 + 1, local_10 < (int)local_c)) {
            *(undefined1 *)((long)&p2->n_rows + (long)local_10) =
                 *(undefined1 *)((long)&p2->n_rows + (long)(int)local_c);
          }
        }
        iVar3 = local_10 + 1;
        pvVar4 = malloc((long)iVar3 << 4);
        if (pvVar4 == (void *)0x0) {
          free(p2);
        }
        else {
          for (local_c = 0; (int)local_c < iVar3; local_c = local_c + 1) {
            puVar5 = (undefined8 *)((long)pvVar4 + (long)(int)local_c * 0x10);
            puVar6 = (undefined8 *)
                     (*(long *)(in_RDI + 0x120) +
                     (ulong)*(byte *)((long)&p2->n_rows + (long)(int)local_c) * 0x10);
            *puVar5 = *puVar6;
            puVar5[1] = puVar6[1];
          }
          for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x5c); local_c = local_c + 1) {
            local_10 = 0;
            while ((local_10 < iVar3 && (*(byte *)((long)&p2->n_rows + (long)local_10) != local_c)))
            {
              local_10 = local_10 + 1;
            }
            if ((local_10 == iVar3) &&
               (*(long *)(*(long *)(in_RDI + 0x120) + (long)(int)local_c * 0x10 + 8) != 0)) {
              free(*(void **)(*(long *)(in_RDI + 0x120) + (long)(int)local_c * 0x10 + 8));
            }
          }
          free(*(void **)(in_RDI + 0x120));
          *(void **)(in_RDI + 0x120) = pvVar4;
          *(int *)(in_RDI + 0x5c) = iVar3;
          for (local_c = 0; (int)local_c < *(int *)(in_RDI + 0x50); local_c = local_c + 1) {
            for (local_10 = 0; local_10 < iVar3; local_10 = local_10 + 1) {
              if (*(char *)(*(long *)(in_RDI + 0x100) + (long)(int)local_c) ==
                  *(char *)((long)&p2->n_rows + (long)local_10)) {
                *(char *)(*(long *)(in_RDI + 0x100) + (long)(int)local_c) = (char)local_10;
                break;
              }
            }
          }
          free(p2);
        }
      }
    }
  }
  return;
}

Assistant:

static void dumb_it_optimize_orders(DUMB_IT_SIGDATA * sigdata) {
	int n, o, p;

    /*int last_invalid = (sigdata->flags & IT_WAS_AN_XM) ? 255 : 253;*/

	unsigned char * order_list;
	int n_patterns;

	IT_PATTERN * pattern;

	if (!sigdata->n_orders || !sigdata->n_patterns) return;

	n_patterns = 0;
	order_list = malloc(sigdata->n_orders);

	if (!order_list) return;

	for (n = 0; n < sigdata->n_orders; n++) {
		if (sigdata->order[n] < sigdata->n_patterns) {
			for (o = 0; o < n_patterns; o++) {
				if (sigdata->order[n] == order_list[o]) break;
			}
			if (o == n_patterns) {
				order_list[n_patterns++] = sigdata->order[n];
			}
		}
	}

	if (!n_patterns) {
		free(order_list);
		return;
	}

	/*for (n = 0; n < n_patterns; n++) {
		dumb_it_optimize_pattern(&sigdata->pattern[order_list[n]]);
	}*/

	for (n = 0; n < n_patterns; n++) {
		for (o = n + 1; o < n_patterns; o++) {
			if ((order_list[n] != order_list[o]) &&
				it_pattern_compare(&sigdata->pattern[order_list[n]], &sigdata->pattern[order_list[o]])) {
				for (p = 0; p < sigdata->n_orders; p++) {
					if (sigdata->order[p] == order_list[o]) {
						sigdata->order[p] = order_list[n];
					}
				}
				for (p = o + 1; p < n_patterns; p++) {
					if (order_list[p] == order_list[o]) {
						order_list[p] = order_list[n];
					}
				}
				order_list[o] = order_list[n];
			}
		}
	}

	qsort(order_list, n_patterns, sizeof(*order_list), &it_order_compare);

	for (n = 0, o = 0; n < n_patterns; n++) {
		if (order_list[n] != order_list[o]) {
			if (++o < n) order_list[o] = order_list[n];
		}
	}

	n_patterns = o + 1;

	pattern = malloc(n_patterns * sizeof(*pattern));
	if (!pattern) {
		free(order_list);
		return;
	}

	for (n = 0; n < n_patterns; n++) {
		pattern[n] = sigdata->pattern[order_list[n]];
	}

	for (n = 0; n < sigdata->n_patterns; n++) {
		for (o = 0; o < n_patterns; o++) {
			if (order_list[o] == n) break;
		}
		if (o == n_patterns) {
			if (sigdata->pattern[n].entry)
				free(sigdata->pattern[n].entry);
		}
	}

	free(sigdata->pattern);
	sigdata->pattern = pattern;
	sigdata->n_patterns = n_patterns;

	for (n = 0; n < sigdata->n_orders; n++) {
		for (o = 0; o < n_patterns; o++) {
			if (sigdata->order[n] == order_list[o]) {
				sigdata->order[n] = o;
				break;
			}
		}
	}

	free(order_list);
}